

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLElement::~XMLElement(XMLElement *this)

{
  XMLAttribute *pXVar1;
  MemPool *pMVar2;
  XMLAttribute *pXVar3;
  
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_001c35e0;
  pXVar3 = this->_rootAttribute;
  while (pXVar3 != (XMLAttribute *)0x0) {
    pXVar1 = pXVar3->_next;
    pMVar2 = pXVar3->_memPool;
    (**pXVar3->_vptr_XMLAttribute)(pXVar3);
    (*pMVar2->_vptr_MemPool[4])(pMVar2,pXVar3);
    this->_rootAttribute = pXVar1;
    pXVar3 = pXVar1;
  }
  XMLComment::~XMLComment((XMLComment *)this);
  return;
}

Assistant:

XMLElement::~XMLElement()
{
    while (_rootAttribute) {
        XMLAttribute* next = _rootAttribute->_next;
        DeleteAttribute(_rootAttribute);
        _rootAttribute = next;
    }
}